

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O3

int luaopen_package(lua_State *L)

{
  int iVar1;
  long lVar2;
  
  luaL_newmetatable(L,"_LOADLIB");
  iVar1 = 1;
  lVar2 = 0;
  lj_lib_pushcc(L,lj_cf_package_unloadlib,1,0);
  lua_setfield(L,-2,"__gc");
  luaL_register(L,"package",package_lib);
  lua_copy(L,-1,-0x2711);
  lua_createtable(L,4,0);
  do {
    lj_lib_pushcc(L,*(lua_CFunction *)((long)package_loaders + lVar2),1,0);
    lua_rawseti(L,-2,iVar1);
    lVar2 = lVar2 + 8;
    iVar1 = iVar1 + 1;
  } while (lVar2 != 0x20);
  lua_setfield(L,-2,"loaders");
  lua_getfield(L,-10000,"LUA_NOENV");
  iVar1 = lua_toboolean(L,-1);
  lua_settop(L,-2);
  setpath(L,"path","LUA_PATH",
          "./?.lua;/usr/local/share/luajit-2.1/?.lua;/usr/local/share/lua/5.1/?.lua;/usr/local/share/lua/5.1/?/init.lua"
          ,iVar1);
  setpath(L,"cpath","LUA_CPATH",
          "./?.so;/usr/local/lib/lua/5.1/?.so;/usr/local/lib/lua/5.1/loadall.so",iVar1);
  lua_pushlstring(L,"/\n;\n?\n!\n-\n",10);
  lua_setfield(L,-2,"config");
  luaL_findtable(L,-10000,"_LOADED",0x10);
  lua_setfield(L,-2,"loaded");
  luaL_findtable(L,-10000,"_PRELOAD",4);
  lua_setfield(L,-2,"preload");
  lua_pushvalue(L,-0x2712);
  luaL_register(L,(char *)0x0,package_global);
  lua_settop(L,-2);
  return 1;
}

Assistant:

LUALIB_API int luaopen_package(lua_State *L)
{
  int i;
  int noenv;
  luaL_newmetatable(L, "_LOADLIB");
  lj_lib_pushcf(L, lj_cf_package_unloadlib, 1);
  lua_setfield(L, -2, "__gc");
  luaL_register(L, LUA_LOADLIBNAME, package_lib);
  lua_copy(L, -1, LUA_ENVIRONINDEX);
  lua_createtable(L, sizeof(package_loaders)/sizeof(package_loaders[0])-1, 0);
  for (i = 0; package_loaders[i] != NULL; i++) {
    lj_lib_pushcf(L, package_loaders[i], 1);
    lua_rawseti(L, -2, i+1);
  }
#if LJ_52
  lua_pushvalue(L, -1);
  lua_setfield(L, -3, "searchers");
#endif
  lua_setfield(L, -2, "loaders");
  lua_getfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  noenv = lua_toboolean(L, -1);
  lua_pop(L, 1);
  setpath(L, "path", LUA_PATH, LUA_PATH_DEFAULT, noenv);
  setpath(L, "cpath", LUA_CPATH, LUA_CPATH_DEFAULT, noenv);
  lua_pushliteral(L, LUA_PATH_CONFIG);
  lua_setfield(L, -2, "config");
  luaL_findtable(L, LUA_REGISTRYINDEX, "_LOADED", 16);
  lua_setfield(L, -2, "loaded");
  luaL_findtable(L, LUA_REGISTRYINDEX, "_PRELOAD", 4);
  lua_setfield(L, -2, "preload");
  lua_pushvalue(L, LUA_GLOBALSINDEX);
  luaL_register(L, NULL, package_global);
  lua_pop(L, 1);
  return 1;
}